

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgcnt(fitsfile *fptr,char *value,char *comm,int *status)

{
  int iVar1;
  int tstatus;
  char card [81];
  char strval [71];
  
  if (0 < *status) {
    return *status;
  }
  tstatus = 0;
  *value = '\0';
  iVar1 = ffgnky(fptr,card,&tstatus);
  if (iVar1 < 1) {
    iVar1 = bcmp(card,"CONTINUE  ",10);
    if (iVar1 == 0) {
      builtin_strncpy(card,"D2345678= ",10);
      ffpsvc(card,strval,comm,&tstatus);
      ffc2s(strval,value,&tstatus);
      if (tstatus != 0) {
        *value = '\0';
      }
    }
    else {
      ffmrky(fptr,-1,status);
    }
  }
  return *status;
}

Assistant:

int ffgcnt( fitsfile *fptr,     /* I - FITS file pointer         */
            char *value,        /* O - continued string value    */
            char *comm,         /* O - continued comment string  */
            int  *status)       /* IO - error status             */
/*
  Attempt to read the next keyword, returning the string value
  if it is a continuation of the previous string keyword value.
  This uses the HEASARC convention for continuing long string values
  over multiple keywords.  Each continued string is terminated with a
  backslash character, and the continuation follows on the next keyword
  which must have the name CONTINUE without an equal sign in column 9
  of the card.  If the next card is not a continuation, then the returned
  value string will be null.
*/
{
    int tstatus;
    char card[FLEN_CARD], strval[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    tstatus = 0;
    value[0] = '\0';

    if (ffgnky(fptr, card, &tstatus) > 0)  /*  read next keyword  */
        return(*status);                   /*  hit end of header  */

    if (strncmp(card, "CONTINUE  ", 10) == 0)  /* a continuation card? */
    {
        strncpy(card, "D2345678=  ", 10); /* overwrite a dummy keyword name */
        ffpsvc(card, strval, comm, &tstatus);  /*  get the string value & comment */
        ffc2s(strval, value, &tstatus);    /* remove the surrounding quotes */

        if (tstatus)       /*  return null if error status was returned  */
           value[0] = '\0';
    }
    else
        ffmrky(fptr, -1, status);  /* reset the keyword pointer */

    return(*status);
}